

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

void __thiscall crnlib::mipmapped_texture::discard_mips(mipmapped_texture *this)

{
  uint uVar1;
  mip_level *this_00;
  uint uVar2;
  vector<crnlib::mip_level_*> *pvVar3;
  ulong uVar4;
  vector<crnlib::mip_level_*> *this_01;
  ulong uVar5;
  
  if ((this->m_faces).m_size != 0) {
    uVar5 = 0;
    do {
      pvVar3 = (this->m_faces).m_p;
      if (1 < pvVar3[uVar5].m_size) {
        this_01 = pvVar3 + uVar5;
        uVar4 = 1;
        do {
          this_00 = this_01->m_p[uVar4];
          if (this_00 != (mip_level *)0x0) {
            mip_level::~mip_level(this_00);
            crnlib_free(this_00);
            pvVar3 = (this->m_faces).m_p;
          }
          uVar4 = uVar4 + 1;
          this_01 = pvVar3 + uVar5;
          uVar1 = pvVar3[uVar5].m_size;
        } while (uVar4 < uVar1);
        if (uVar1 != 1) {
          if (uVar1 == 0) {
            uVar2 = 0;
            if (this_01->m_capacity == 0) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_01,1,true,8,(object_mover)0x0,false);
              uVar2 = this_01->m_size;
            }
            memset(this_01->m_p + uVar2,0,(ulong)(1 - uVar2) << 3);
          }
          this_01->m_size = 1;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->m_faces).m_size);
  }
  return;
}

Assistant:

void mipmapped_texture::discard_mips() {
  for (uint f = 0; f < m_faces.size(); f++) {
    if (m_faces[f].size() > 1) {
      for (uint l = 1; l < m_faces[f].size(); l++)
        crnlib_delete(m_faces[f][l]);

      m_faces[f].resize(1);
    }
  }

  CRNLIB_ASSERT(check());
}